

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::read_crn(mipmapped_texture *this,data_stream_serializer *serializer)

{
  bool bVar1;
  uint data_size;
  uchar *pData;
  dynamic_string *this_00;
  char *pFilename;
  undefined1 local_30 [8];
  vector<unsigned_char> crn_data;
  data_stream_serializer *serializer_local;
  mipmapped_texture *this_local;
  
  crn_data._8_8_ = serializer;
  vector<unsigned_char>::vector((vector<unsigned_char> *)local_30);
  bVar1 = data_stream_serializer::read_entire_file
                    ((data_stream_serializer *)crn_data._8_8_,(vector<unsigned_char> *)local_30);
  if (bVar1) {
    pData = vector<unsigned_char>::get_ptr((vector<unsigned_char> *)local_30);
    data_size = vector<unsigned_char>::size((vector<unsigned_char> *)local_30);
    this_00 = data_stream_serializer::get_name((data_stream_serializer *)crn_data._8_8_);
    pFilename = dynamic_string::get_ptr(this_00);
    this_local._7_1_ = read_crn_from_memory(this,pData,data_size,pFilename);
  }
  else {
    set_last_error(this,"Failed reading CRN file");
    this_local._7_1_ = false;
  }
  vector<unsigned_char>::~vector((vector<unsigned_char> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool mipmapped_texture::read_crn(data_stream_serializer& serializer) {
  crnlib::vector<uint8> crn_data;
  if (!serializer.read_entire_file(crn_data)) {
    set_last_error("Failed reading CRN file");
    return false;
  }
  return read_crn_from_memory(crn_data.get_ptr(), crn_data.size(), serializer.get_name().get_ptr());
}